

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_ps.c
# Opt level: O1

MPP_RET avs2d_parse_sequence_header(Avs2dCtx_t *p_dec)

{
  BitReadCtx_t *bitctx;
  Avs2dSeqHeader_t *vsh;
  RK_U32 *pRVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  RK_S32 RVar5;
  MPP_RET MVar6;
  undefined8 in_RAX;
  char *fmt;
  MPP_RET unaff_EBP;
  int iVar7;
  ulong uVar8;
  Avs2dRps_t *rps;
  undefined8 uStack_38;
  RK_S32 _out;
  
  bitctx = &p_dec->bitctx;
  vsh = &p_dec->vsh;
  uStack_38 = in_RAX;
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","Bitread buf %p, data %p, buf_len %d, left %d\n",
               "avs2d_parse_sequence_header",(p_dec->bitctx).buf,(p_dec->bitctx).data_,
               (ulong)(uint)(p_dec->bitctx).buf_len,(ulong)(p_dec->bitctx).bytes_left_);
  }
  memset(vsh,0,0x530);
  MVar6 = mpp_read_bits(bitctx,8,&_out);
  (p_dec->bitctx).ret = MVar6;
  iVar7 = 6;
  if (MVar6 == MPP_OK) {
    vsh->profile_id = (RK_U8)_out;
    iVar7 = 0;
  }
  if (iVar7 == 6) goto LAB_00183bd6;
  if (iVar7 != 0) {
    return unaff_EBP;
  }
  uVar8 = (ulong)vsh->profile_id;
  if ((0x22 < uVar8) || ((0x500040000U >> (uVar8 & 0x3f) & 1) == 0)) {
    fmt = "profile_id 0x%02x is not supported.\n";
    goto LAB_001838b5;
  }
  MVar6 = mpp_read_bits(bitctx,8,&_out);
  (p_dec->bitctx).ret = MVar6;
  iVar7 = 6;
  if (MVar6 == MPP_OK) {
    (p_dec->vsh).level_id = (RK_U8)_out;
    iVar7 = 0;
  }
  if (iVar7 == 6) goto LAB_00183bd6;
  if (iVar7 != 0) {
    return unaff_EBP;
  }
  bVar2 = (p_dec->vsh).level_id;
  if (0x6a < bVar2) {
    fmt = "level_id 0x%02x is not supported.\n";
LAB_0018388d:
    uVar8 = (ulong)bVar2;
    goto LAB_001838b5;
  }
  MVar6 = mpp_read_bits(bitctx,1,&_out);
  (p_dec->bitctx).ret = MVar6;
  iVar7 = 6;
  if (MVar6 == MPP_OK) {
    (p_dec->vsh).progressive_sequence = (RK_U8)_out;
    iVar7 = 0;
  }
  if (iVar7 == 6) goto LAB_00183bd6;
  if (iVar7 != 0) {
    return unaff_EBP;
  }
  MVar6 = mpp_read_bits(bitctx,1,&_out);
  (p_dec->bitctx).ret = MVar6;
  iVar7 = 6;
  if (MVar6 == MPP_OK) {
    (p_dec->vsh).field_coded_sequence = (RK_U8)_out;
    iVar7 = 0;
  }
  if (iVar7 == 6) goto LAB_00183bd6;
  if (iVar7 != 0) {
    return unaff_EBP;
  }
  MVar6 = mpp_read_bits(bitctx,0xe,&_out);
  (p_dec->bitctx).ret = MVar6;
  iVar7 = 6;
  if (MVar6 == MPP_OK) {
    (p_dec->vsh).horizontal_size = _out;
    iVar7 = 0;
  }
  if (iVar7 == 6) goto LAB_00183bd6;
  if (iVar7 != 0) {
    return unaff_EBP;
  }
  MVar6 = mpp_read_bits(bitctx,0xe,&_out);
  (p_dec->bitctx).ret = MVar6;
  iVar7 = 6;
  if (MVar6 == MPP_OK) {
    (p_dec->vsh).vertical_size = _out;
    iVar7 = 0;
  }
  if (iVar7 == 6) goto LAB_00183bd6;
  if (iVar7 != 0) {
    return unaff_EBP;
  }
  uVar4 = (p_dec->vsh).horizontal_size;
  if ((uVar4 < 0x10) || ((p_dec->vsh).vertical_size < 0x10)) {
    _mpp_log_l(2,"avs2d_ps","invalid sequence width(%d), height(%d).\n",
               "avs2d_parse_sequence_header",(ulong)uVar4,(ulong)(p_dec->vsh).vertical_size);
    return MPP_NOK;
  }
  MVar6 = mpp_read_bits(bitctx,2,&_out);
  (p_dec->bitctx).ret = MVar6;
  iVar7 = 6;
  if (MVar6 == MPP_OK) {
    (p_dec->vsh).chroma_format = (RK_U8)_out;
    iVar7 = 0;
  }
  if (iVar7 == 6) goto LAB_00183bd6;
  if (iVar7 != 0) {
    return unaff_EBP;
  }
  bVar2 = (p_dec->vsh).chroma_format;
  if (bVar2 != 1) {
    fmt = "chroma_format 0x%02x is not supported.\n";
    goto LAB_0018388d;
  }
  MVar6 = mpp_read_bits(bitctx,3,&_out);
  (p_dec->bitctx).ret = MVar6;
  iVar7 = 6;
  if (MVar6 == MPP_OK) {
    (p_dec->vsh).sample_precision = (RK_U8)_out;
    iVar7 = 0;
  }
  if (iVar7 == 6) goto LAB_00183bd6;
  if (iVar7 != 0) {
    return unaff_EBP;
  }
  if (vsh->profile_id == '\"') {
    MVar6 = mpp_read_bits(bitctx,3,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).encoding_precision = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 0) goto LAB_00183aee;
LAB_00183ac6:
    if (iVar7 != 6) {
      return unaff_EBP;
    }
  }
  else {
    (p_dec->vsh).encoding_precision = '\x01';
LAB_00183aee:
    bVar2 = (p_dec->vsh).encoding_precision;
    uVar8 = (ulong)bVar2;
    (p_dec->vsh).bit_depth = bVar2 * '\x02' + '\x06';
    bVar3 = (p_dec->vsh).sample_precision;
    if ((byte)(bVar3 - 3) < 0xfe) {
      fmt = "sample_precision 0x%02x is not supported.\n";
      uVar8 = (ulong)bVar3;
LAB_001838b5:
      _mpp_log_l(2,"avs2d_ps",fmt,"avs2d_parse_sequence_header",uVar8);
      return MPP_NOK;
    }
    if ((byte)(bVar2 - 3) < 0xfe) {
      fmt = "encoding_precision 0x%02x is not supported.\n";
      goto LAB_001838b5;
    }
    MVar6 = mpp_read_bits(bitctx,4,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).aspect_ratio = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,4,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).frame_rate_code = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,0x12,&_out);
    (p_dec->bitctx).ret = MVar6;
    if (MVar6 != MPP_OK) goto LAB_00183bd6;
    (p_dec->vsh).bit_rate = _out << 0xc;
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      iVar7 = 0;
      if (((RK_U8)_out != '\x01') && (iVar7 = 0, ((byte)avs2d_parse_debug & 4) != 0)) {
        iVar7 = 0;
        _mpp_log_l(4,"avs2d_ps","expected marker_bit 1 while received 0(%d).\n",(char *)0x0,0x157);
      }
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,0xc,&_out);
    (p_dec->bitctx).ret = MVar6;
    if (MVar6 != MPP_OK) goto LAB_00183bd6;
    pRVar1 = &(p_dec->vsh).bit_rate;
    *pRVar1 = *pRVar1 + _out;
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).low_delay = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      iVar7 = 0;
      if (((RK_U8)_out != '\x01') && (iVar7 = 0, ((byte)avs2d_parse_debug & 4) != 0)) {
        iVar7 = 0;
        _mpp_log_l(4,"avs2d_ps","expected marker_bit 1 while received 0(%d).\n",(char *)0x0,0x15b);
      }
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).enable_temporal_id = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,0x12,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).bbv_buffer_size = _out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,3,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).lcu_size = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    bVar2 = (p_dec->vsh).lcu_size;
    uVar8 = (ulong)bVar2;
    if ((byte)(bVar2 - 7) < 0xfd) {
      fmt = "invalid lcu size: %d\n";
      goto LAB_001838b5;
    }
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).enable_weighted_quant = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    if ((p_dec->vsh).enable_weighted_quant != '\0') {
      parse_sequence_wqm(bitctx,vsh);
    }
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    if (MVar6 != MPP_OK) goto LAB_00183bd6;
    (p_dec->vsh).enable_background_picture = (byte)((ulong)uStack_38 >> 0x20) ^ 1;
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).enable_mhp_skip = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).enable_dhp = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).enable_wsm = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).enable_amp = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).enable_nsqt = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).enable_nsip = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).enable_2nd_transform = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).enable_sao = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).enable_alf = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).enable_pmvr = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      iVar7 = 0;
      if (((RK_U8)_out != '\x01') && (iVar7 = 0, ((byte)avs2d_parse_debug & 4) != 0)) {
        iVar7 = 0;
        _mpp_log_l(4,"avs2d_ps","expected marker_bit 1 while received 0(%d).\n",(char *)0x0,0x176);
      }
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    iVar7 = 6;
    MVar6 = mpp_read_bits(bitctx,6,&_out);
    RVar5 = _out;
    (p_dec->bitctx).ret = MVar6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).num_of_rps = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 == 6) goto LAB_00183bd6;
    if (iVar7 != 0) {
      return unaff_EBP;
    }
    if ((p_dec->vsh).num_of_rps == '\0') {
      unaff_EBP = MPP_OK;
      _out = RVar5;
    }
    else {
      rps = (p_dec->vsh).seq_rps;
      uVar8 = 0;
      do {
        if (((byte)avs2d_parse_debug & 8) != 0) {
          _mpp_log_l(4,"avs2d_ps","--------rcs[%d]--------","avs2d_parse_sequence_header",
                     uVar8 & 0xffffffff);
        }
        unaff_EBP = parse_one_rps(bitctx,rps);
        if (unaff_EBP < MPP_OK) {
          if (((byte)avs2d_parse_debug & 4) != 0) {
            _mpp_log_l(4,"avs2d_ps","Function error(%d).\n",(char *)0x0,0x17d);
            return unaff_EBP;
          }
          return unaff_EBP;
        }
        uVar8 = uVar8 + 1;
        rps = rps + 1;
      } while (uVar8 < (p_dec->vsh).num_of_rps);
    }
    if ((p_dec->vsh).low_delay == '\0') {
      MVar6 = mpp_read_bits(bitctx,5,&_out);
      (p_dec->bitctx).ret = MVar6;
      iVar7 = 6;
      if (MVar6 == MPP_OK) {
        (p_dec->vsh).picture_reorder_delay = (RK_U8)_out;
        iVar7 = 0;
      }
      if (iVar7 != 0) goto LAB_00183ac6;
    }
    else {
      (p_dec->vsh).picture_reorder_delay = '\0';
    }
    MVar6 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar6;
    iVar7 = 6;
    if (MVar6 == MPP_OK) {
      (p_dec->vsh).enable_clf = (RK_U8)_out;
      iVar7 = 0;
    }
    if (iVar7 != 6) {
      if (iVar7 != 0) {
        return unaff_EBP;
      }
      MVar6 = mpp_read_bits(bitctx,2,&_out);
      (p_dec->bitctx).ret = MVar6;
      if (MVar6 == MPP_OK) {
        if (_out == 0) {
          return unaff_EBP;
        }
        if (((byte)avs2d_parse_debug & 4) != 0) {
          _mpp_log_l(4,"avs2d_ps","reserver bits error.\n",(char *)0x0);
          return unaff_EBP;
        }
        return unaff_EBP;
      }
    }
  }
LAB_00183bd6:
  return (p_dec->bitctx).ret;
}

Assistant:

MPP_RET avs2d_parse_sequence_header(Avs2dCtx_t *p_dec)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i;
    RK_U32 val_temp = 0;
    Avs2dRps_t *rps = NULL;
    BitReadCtx_t *bitctx = &p_dec->bitctx;
    Avs2dSeqHeader_t *vsh = &p_dec->vsh;

    AVS2D_PARSE_TRACE("Bitread buf %p, data %p, buf_len %d, left %d\n", bitctx->buf, bitctx->data_, bitctx->buf_len, bitctx->bytes_left_);
    memset(vsh, 0, sizeof(Avs2dSeqHeader_t));
    READ_BITS(bitctx, 8, &vsh->profile_id);
    //!< check profile_id
    if (vsh->profile_id != 0x12 && vsh->profile_id != 0x20 && vsh->profile_id != 0x22) {
        ret = MPP_NOK;
        mpp_err_f("profile_id 0x%02x is not supported.\n", vsh->profile_id);
        goto __FAILED;
    }
    READ_BITS(bitctx, 8, &vsh->level_id);
    if (vsh->level_id > 0x6A) {
        ret = MPP_NOK;
        mpp_err_f("level_id 0x%02x is not supported.\n", vsh->level_id);
        goto __FAILED;
    }
    READ_ONEBIT(bitctx, &vsh->progressive_sequence);
    READ_ONEBIT(bitctx, &vsh->field_coded_sequence);
    READ_BITS(bitctx, 14, &vsh->horizontal_size);
    READ_BITS(bitctx, 14, &vsh->vertical_size);
    if (vsh->horizontal_size < 16 || vsh->vertical_size < 16) {
        ret = MPP_NOK;
        mpp_err_f("invalid sequence width(%d), height(%d).\n",
                  vsh->horizontal_size, vsh->vertical_size);
        goto __FAILED;
    }

    READ_BITS(bitctx, 2,  &vsh->chroma_format);
    if (vsh->chroma_format != CHROMA_420) {
        ret = MPP_NOK;
        mpp_err_f("chroma_format 0x%02x is not supported.\n", vsh->chroma_format);
        goto __FAILED;
    }
    READ_BITS(bitctx, 3, &vsh->sample_precision);
    if (vsh->profile_id == MAIN10_PROFILE) {
        READ_BITS(bitctx, 3, &vsh->encoding_precision);
    } else {
        vsh->encoding_precision = 1;
    }
    vsh->bit_depth = 6 + (vsh->encoding_precision << 1);

    if (vsh->sample_precision < 1 || vsh->sample_precision > 2) {
        ret = MPP_NOK;
        mpp_err_f("sample_precision 0x%02x is not supported.\n", vsh->sample_precision);
        goto __FAILED;
    }
    if (vsh->encoding_precision < 1 || vsh->encoding_precision > 2) {
        ret = MPP_NOK;
        mpp_err_f("encoding_precision 0x%02x is not supported.\n", vsh->encoding_precision);
        goto __FAILED;
    }

    READ_BITS(bitctx, 4, &vsh->aspect_ratio);
    READ_BITS(bitctx, 4, &vsh->frame_rate_code);
    READ_BITS(bitctx, 18, &val_temp); //!< bit_rate_lower_18
    vsh->bit_rate = val_temp << 12;
    READ_MARKER_BIT(bitctx);
    READ_BITS(bitctx, 12, &val_temp); //!< bit_rate_upper_12
    vsh->bit_rate += val_temp;
    READ_ONEBIT(bitctx, &vsh->low_delay);
    READ_MARKER_BIT(bitctx);
    READ_ONEBIT(bitctx, &vsh->enable_temporal_id);
    READ_BITS(bitctx, 18, &vsh->bbv_buffer_size);
    READ_BITS(bitctx, 3, &vsh->lcu_size);
    if (vsh->lcu_size < 4 || vsh->lcu_size > 6) {
        ret = MPP_NOK;
        mpp_err_f("invalid lcu size: %d\n", vsh->lcu_size);
        goto __FAILED;
    }

    READ_ONEBIT(bitctx, &vsh->enable_weighted_quant);
    if (vsh->enable_weighted_quant) {
        parse_sequence_wqm(bitctx, vsh);
    }

    READ_ONEBIT(bitctx, &val_temp);
    vsh->enable_background_picture = val_temp ^ 0x01;
    READ_ONEBIT(bitctx, &vsh->enable_mhp_skip);
    READ_ONEBIT(bitctx, &vsh->enable_dhp);
    READ_ONEBIT(bitctx, &vsh->enable_wsm);
    READ_ONEBIT(bitctx, &vsh->enable_amp);
    READ_ONEBIT(bitctx, &vsh->enable_nsqt);
    READ_ONEBIT(bitctx, &vsh->enable_nsip);
    READ_ONEBIT(bitctx, &vsh->enable_2nd_transform);
    READ_ONEBIT(bitctx, &vsh->enable_sao);
    READ_ONEBIT(bitctx, &vsh->enable_alf);
    READ_ONEBIT(bitctx, &vsh->enable_pmvr);
    READ_MARKER_BIT(bitctx);

    //!< parse rps
    READ_BITS(bitctx, 6, &vsh->num_of_rps);
    for (i = 0; i < vsh->num_of_rps; i++) {
        rps = &vsh->seq_rps[i];
        AVS2D_PARSE_TRACE("--------rcs[%d]--------", i);
        FUN_CHECK(ret = parse_one_rps(bitctx, rps));
    }

    if (vsh->low_delay == 0) {
        READ_BITS(bitctx, 5, &vsh->picture_reorder_delay);
    } else {
        vsh->picture_reorder_delay = 0;
    }
    READ_ONEBIT(bitctx, &vsh->enable_clf);
    READ_BITS(bitctx, 2, &val_temp); //!< reserved 2bits 00
    if (val_temp) {
        AVS2D_DBG(AVS2D_DBG_WARNNING, "reserver bits error.\n");
    }
    return ret;
__BITREAD_ERR:
    return ret = bitctx->ret;
__FAILED:
    return ret;
}